

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O3

double __thiscall QDoubleSpinBox::valueFromText(QDoubleSpinBox *this,QString *text)

{
  QDoubleSpinBoxPrivate *this_00;
  long in_FS_OFFSET;
  double dVar1;
  State state;
  int pos;
  State local_60;
  int local_5c;
  QString local_58;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDoubleSpinBoxPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_58.d.d = (text->d).d;
  local_58.d.ptr = (text->d).ptr;
  local_58.d.size = (text->d).size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_5c = QLineEdit::cursorPosition((this_00->super_QAbstractSpinBoxPrivate).edit);
  local_60 = Acceptable;
  QDoubleSpinBoxPrivate::validateAndInterpret(&local_40,this_00,&local_58,&local_5c,&local_60);
  dVar1 = (double)::QVariant::toDouble((bool *)&local_40);
  ::QVariant::~QVariant(&local_40);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return dVar1;
  }
  __stack_chk_fail();
}

Assistant:

double QDoubleSpinBox::valueFromText(const QString &text) const
{
    Q_D(const QDoubleSpinBox);

    QString copy = text;
    int pos = d->edit->cursorPosition();
    QValidator::State state = QValidator::Acceptable;
    return d->validateAndInterpret(copy, pos, state).toDouble();
}